

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionResult::~AssertionResult(AssertionResult *this)

{
  AssertionResultData::~AssertionResultData(&this->m_resultData);
  AssertionInfo::~AssertionInfo(&this->m_info);
  return;
}

Assistant:

AssertionResult::~AssertionResult() {}